

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  uint64_t uVar2;
  string local_88;
  string local_68;
  string local_48;
  allocator local_22;
  allocator local_21;
  
  LazyStat<Catch::TestCaseInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestCaseInfo,testInfo);
  std::__cxx11::string::string((string *)&local_88,"TestCase",&local_22);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_88);
  std::__cxx11::string::string((string *)&local_68,"name",&local_21);
  trim(&local_48,&testInfo->name);
  XmlWriter::writeAttribute(this_00,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    uVar2 = anon_unknown_23::getCurrentTicks();
    (this->m_testCaseTimer).m_ticks = uVar2;
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", trim( testInfo.name ) );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }